

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

int AF_APlayerPawn_ResetAirSupply
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  APlayerPawn *this;
  VMValue *pVVar2;
  bool bVar3;
  bool local_4b;
  bool local_41;
  int u;
  bool playgasp;
  APlayerPawn *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x503,
                  "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    this = (APlayerPawn *)(param->field_0).field_1.a;
    local_4b = true;
    if (this != (APlayerPawn *)0x0) {
      local_4b = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass);
    }
    if (local_4b != false) {
      if (numparam < 2) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x504,
                        "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        iVar1 = (pVVar2->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x504,
                        "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[1].field_0.i;
      }
      local_41 = iVar1 != 0;
      bVar3 = APlayerPawn::ResetAirSupply(this,local_41);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x505,
                        "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar3);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(APlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x503,
                  "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x503,
                "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(APlayerPawn, ResetAirSupply)
{
	PARAM_SELF_PROLOGUE(APlayerPawn);
	PARAM_BOOL_DEF(playgasp);
	ACTION_RETURN_BOOL(self->ResetAirSupply(playgasp));
}